

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int nextStronghold(StrongholdIter *sh,Generator *g)

{
  int iVar1;
  ulong uVar2;
  Pos PVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  uint64_t *rng;
  ulong local_38;
  
  lVar8 = 0;
  uVar10 = 0;
  uVar7 = 0;
  do {
    iVar1 = isStrongholdBiome(sh->mc,(uint)lVar8);
    uVar9 = 1L << ((byte)lVar8 & 0x3f);
    uVar2 = 0;
    if (iVar1 != 0) {
      uVar2 = uVar9;
    }
    iVar1 = isStrongholdBiome(sh->mc,(uint)lVar8 | 0x80);
    uVar5 = 0;
    if (iVar1 != 0) {
      uVar5 = uVar9;
    }
    uVar7 = uVar7 | uVar5;
    uVar10 = uVar10 | uVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x40);
  if (sh->mc < 0x18) {
    if (sh->mc < 2) {
      return 0;
    }
    iVar1 = (sh->nextapprox).x;
    iVar4 = (sh->nextapprox).z;
    rng = &sh->rnds;
  }
  else {
    if (g == (Generator *)0x0) {
      sh->rnds = sh->rnds * 0xbb20b4600a69 + 0x40942de6ba & 0xffffffffffff;
      PVar3 = sh->nextapprox;
      goto LAB_0010c3d9;
    }
    lVar8 = sh->rnds * 0x5deece66d + 0xb;
    uVar2 = lVar8 * 0x5deece66d + 0xb;
    sh->rnds = uVar2 & 0xffffffffffff;
    local_38 = (long)(int)(uVar2 >> 0x10) + (ulong)((uint)lVar8 & 0xffff0000) * 0x10000 &
               0xffffffffffff ^ 0x5deece66d;
    rng = &local_38;
    iVar1 = (sh->nextapprox).x;
    iVar4 = (sh->nextapprox).z;
  }
  PVar3 = locateBiome(g,iVar1,0,iVar4,0x70,uVar10,uVar7,rng,(int *)0x0);
LAB_0010c3d9:
  (sh->pos).x = PVar3.x & 0xfffffff0U | 4;
  (sh->pos).z = PVar3.z & 0xfffffff0U | 4;
  iVar1 = sh->ringidx + 1;
  sh->ringidx = iVar1;
  dVar11 = 6.283185307179586 / (double)sh->ringmax + sh->angle;
  sh->angle = dVar11;
  if (iVar1 == sh->ringmax) {
    iVar4 = sh->ringnum;
    sh->ringnum = iVar4 + 1;
    sh->ringidx = 0;
    iVar6 = 0x80 - sh->index;
    iVar1 = (iVar1 * 2) / (iVar4 + 2) + iVar1;
    if (iVar1 < iVar6) {
      iVar6 = iVar1;
    }
    sh->ringmax = iVar6;
    uVar7 = sh->rnds * 0x5deece66d + 0xb;
    uVar10 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
    sh->rnds = uVar10;
    dVar12 = (double)(uVar10 >> 0x15 | (uVar7 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 *
             3.141592653589793;
    dVar11 = dVar11 + dVar12 + dVar12;
    sh->angle = dVar11;
  }
  if (sh->mc < 0xc) {
    uVar7 = sh->rnds * 0x5deece66d + 0xb;
    uVar10 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
    sh->rnds = uVar10;
    dVar12 = ((double)(uVar10 >> 0x15 | (uVar7 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 +
             1.25) * 32.0;
  }
  else {
    uVar7 = sh->rnds * 0x5deece66d + 0xb;
    uVar10 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
    sh->rnds = uVar10;
    dVar12 = ((double)(uVar10 >> 0x15 | (uVar7 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 +
             -0.5) * 32.0 * 2.5 + (double)sh->ringnum * 6.0 * 32.0 + 128.0;
  }
  sh->dist = dVar12;
  dVar11 = cos(dVar11);
  dVar11 = round(dVar11 * sh->dist);
  (sh->nextapprox).x = (int)dVar11 << 4 | 8;
  dVar11 = sin(sh->angle);
  dVar11 = round(dVar11 * sh->dist);
  (sh->nextapprox).z = (int)dVar11 << 4 | 8;
  iVar1 = sh->index;
  sh->index = iVar1 + 1;
  iVar4 = 3;
  if (0xb < sh->mc) {
    iVar4 = 0x80;
  }
  return iVar4 - iVar1;
}

Assistant:

int nextStronghold(StrongholdIter *sh, const Generator *g)
{
    uint64_t validB = 0, validM = 0;
    int i;
    for (i = 0; i < 64; i++)
    {
        if (isStrongholdBiome(sh->mc, i))
            validB |= (1ULL << i);
        if (isStrongholdBiome(sh->mc, i+128))
            validM |= (1ULL << i);
    }

    if (sh->mc > MC_1_19_2)
    {
        if (g)
        {
            uint64_t lbr = sh->rnds;
            setSeed(&lbr, nextLong(&sh->rnds));
            sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
                validB, validM, &lbr, NULL);
        }
        else
        {
            nextLong(&sh->rnds);
            sh->pos = sh->nextapprox;
        }
    }
    else if (sh->mc >= MC_B1_8)
    {
        sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
            validB, validM, &sh->rnds, NULL);
    }
    else
    {
        return 0;
    }
    // staircase is located at (4, 4) in chunk
    sh->pos.x = (sh->pos.x & ~15) + 4;
    sh->pos.z = (sh->pos.z & ~15) + 4;

    sh->ringidx++;
    sh->angle += 2 * PI / sh->ringmax;

    if (sh->ringidx == sh->ringmax)
    {
        sh->ringnum++;
        sh->ringidx = 0;
        sh->ringmax = sh->ringmax + 2*sh->ringmax / (sh->ringnum+1);
        if (sh->ringmax > 128-sh->index)
            sh->ringmax = 128-sh->index;
        sh->angle += nextDouble(&sh->rnds) * PI * 2.0;
    }

    if (sh->mc >= MC_1_9)
    {
        sh->dist = (4.0 * 32.0) + (6.0 * sh->ringnum * 32.0) +
            (nextDouble(&sh->rnds) - 0.5) * 32 * 2.5;
    }
    else
    {
        sh->dist = (1.25 + nextDouble(&sh->rnds)) * 32.0;
    }

    sh->nextapprox.x = ((int)round(cos(sh->angle) * sh->dist) * 16) + 8;
    sh->nextapprox.z = ((int)round(sin(sh->angle) * sh->dist) * 16) + 8;
    sh->index++;

    return (sh->mc >= MC_1_9 ? 128 : 3) - (sh->index-1);
}